

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  char *pcVar5;
  string *psVar6;
  long lVar7;
  bool *pbVar8;
  bool bVar9;
  bool bVar10;
  string lang;
  string relFromBinary;
  string objectName;
  string repVar;
  string relFromSource;
  string local_108;
  cmLocalGenerator *local_e8;
  cmSourceFile *local_e0;
  string local_d8;
  char *local_b8;
  bool *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  string local_80;
  string local_60;
  string *local_40;
  string *local_38;
  
  local_e0 = source;
  local_b8 = customOutputExtension;
  local_b0 = hasSourceExtension;
  local_40 = dir_max;
  psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a8,&this->StateSnapshot);
  pcVar5 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_a8);
  std::__cxx11::string::string((string *)&local_d8,pcVar5,(allocator *)local_a8);
  local_e8 = this;
  cmOutputConverter::ConvertToRelativePath
            (&local_60,&this->super_cmOutputConverter,&local_d8,psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_60._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0x932,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(local_60._M_dataplus._M_p);
  local_38 = __return_storage_ptr__;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a8,&this->StateSnapshot);
  pcVar5 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_a8);
  std::__cxx11::string::string((string *)&local_108,pcVar5,(allocator *)local_a8);
  cmOutputConverter::ConvertToRelativePath
            (&local_d8,&this->super_cmOutputConverter,&local_108,psVar4);
  paVar1 = &local_108.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_d8._M_string_length == 0) {
    __assert_fail("!relFromBinary.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0x939,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(local_d8._M_dataplus._M_p);
  local_a8._8_8_ = 0;
  local_98[0] = '\0';
  local_a8._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98;
  std::__cxx11::string::_M_assign((string *)local_a8);
  psVar4 = local_38;
  bVar3 = cmsys::SystemTools::FileIsFullPath((char *)local_a8._0_8_);
  if ((bVar3) && (bVar3 = cmake::GetIsInTryCompile(local_e8->GlobalGenerator->CMakeInstance), bVar3)
     ) {
    psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(local_e0);
    cmsys::SystemTools::GetFilenameName(&local_108,psVar6);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"KEEP_EXTENSION","");
  bVar3 = cmSourceFile::GetPropertyAsBool(local_e0,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  pbVar8 = local_b0;
  bVar9 = true;
  if (bVar3) goto LAB_003b62a6;
  bVar3 = NeedBackwardsCompatibility_2_4(local_e8);
  if (bVar3) {
    bVar10 = local_b8 != (char *)0x0;
LAB_003b61f0:
    lVar7 = std::__cxx11::string::rfind((char)local_a8,0x2e);
    if (lVar7 != -1) {
      std::__cxx11::string::substr((ulong)&local_108,(ulong)local_a8);
      std::__cxx11::string::operator=((string *)local_a8,(string *)&local_108);
      pbVar8 = local_b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        pbVar8 = local_b0;
      }
    }
    if (bVar10) {
      std::__cxx11::string::append(local_a8);
      bVar9 = false;
      goto LAB_003b62a6;
    }
    bVar9 = false;
  }
  else {
    cmSourceFile::GetLanguage_abi_cxx11_(&local_108,local_e0);
    if (local_108._M_string_length == 0) {
      bVar3 = false;
    }
    else {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_98 + 0x18),"CMAKE_","");
      std::__cxx11::string::_M_append(local_98 + 0x18,(ulong)local_108._M_dataplus._M_p);
      std::__cxx11::string::append(local_98 + 0x18);
      bVar3 = cmMakefile::IsOn(local_e8->Makefile,(string *)(local_98 + 0x18));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    bVar10 = local_b8 != (char *)0x0;
    bVar9 = true;
    pbVar8 = local_b0;
    if ((bVar3 | bVar10) == 1) goto LAB_003b61f0;
  }
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            (&local_108,local_e8->GlobalGenerator,local_e0);
  std::__cxx11::string::_M_append(local_a8,(ulong)local_108._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
LAB_003b62a6:
  if (pbVar8 != (bool *)0x0) {
    *pbVar8 = bVar9;
  }
  psVar6 = CreateSafeUniqueObjectFileName(local_e8,(string *)local_a8,local_40);
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar4,pcVar2,pcVar2 + psVar6->_M_string_length);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a8._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_98) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_98._1_7_,local_98[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource =
    this->ConvertToRelativePath(this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource.c_str());
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary =
    this->ConvertToRelativePath(this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary.c_str());
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource)) {
    objectName = relFromBinary;
  } else if (relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName.c_str())) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        std::string repVar = "CMAKE_";
        repVar += lang;
        repVar += "_OUTPUT_EXTENSION_REPLACE";
        replaceExt = this->Makefile->IsOn(repVar);
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}